

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O2

void __thiscall
AbstractTransaction_SetUnlockingScript_bytedata_Test::
AbstractTransaction_SetUnlockingScript_bytedata_Test
          (AbstractTransaction_SetUnlockingScript_bytedata_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005ba7d0;
  return;
}

Assistant:

TEST(AbstractTransaction, SetUnlockingScript_bytedata) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));

  std::vector<ByteData> bytedatas;
  // error
  EXPECT_THROW(tx.SetUnlockingScript(3, bytedatas), CfdException);

  bytedatas.push_back(
      ByteData(
          "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763"));

  EXPECT_NO_THROW(tx.SetUnlockingScript(0, bytedatas));
  EXPECT_STREQ(
      tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str(),
      "2102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
}